

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecureDataManager.cpp
# Opt level: O0

bool __thiscall SecureDataManager::setUserPIN(SecureDataManager *this,ByteString *userPIN)

{
  size_t sVar1;
  long in_RDI;
  ByteString *in_stack_00000168;
  ByteString *in_stack_00000170;
  SecureDataManager *in_stack_00000178;
  bool local_1;
  
  if (((*(byte *)(in_RDI + 0x58) & 1) == 0) && ((*(byte *)(in_RDI + 0x59) & 1) == 0)) {
    softHSMLog(7,"setUserPIN",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/SecureDataManager.cpp"
               ,0xe6,"Must be logged in to change the user PIN");
    local_1 = false;
  }
  else {
    sVar1 = ByteString::size((ByteString *)0x1c87e0);
    if (sVar1 == 0) {
      softHSMLog(7,"setUserPIN",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/data_mgr/SecureDataManager.cpp"
                 ,0xee,"Zero length PIN specified");
      local_1 = false;
    }
    else {
      local_1 = pbeEncryptKey(in_stack_00000178,in_stack_00000170,in_stack_00000168);
    }
  }
  return local_1;
}

Assistant:

bool SecureDataManager::setUserPIN(const ByteString& userPIN)
{
	// Check if the SO or the user is logged in
	if (!soLoggedIn && !userLoggedIn)
	{
		DEBUG_MSG("Must be logged in to change the user PIN");

		return false;
	}

	// Check the new PIN
	if (userPIN.size() == 0)
	{
		DEBUG_MSG("Zero length PIN specified");

		return false;
	}

	return pbeEncryptKey(userPIN, userEncryptedKey);
}